

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CborValue::Serialize
          (Error *__return_storage_ptr__,CborValue *this,uint8_t *aBuf,size_t *aLength,
          size_t aMaxLength)

{
  size_t sVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string sStack_68;
  format_string_checker<char> local_48;
  
  if (this->mCbor == (cn_cbor *)0x0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/cbor.cpp"
                  ,0x49,
                  "Error ot::commissioner::CborValue::Serialize(uint8_t *, size_t &, size_t) const")
    ;
  }
  sVar1 = cn_cbor_encoder_write(aBuf,0,aMaxLength,this->mCbor);
  if (sVar1 == 0xffffffffffffffff) {
    local_48.types_[0] = none_type;
    local_48.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "serialize CBOR value";
    local_48.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x14;
    local_48.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_48.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_48.parse_funcs_[0] = (parse_func)0x0;
    pcVar2 = "serialize CBOR value";
    local_48.context_.types_ = local_48.types_;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",&local_48);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v10::vformat_abi_cxx11_
              (&sStack_68,(v10 *)"serialize CBOR value",(string_view)ZEXT816(0x14),args);
    __return_storage_ptr__->mCode = kOutOfMemory;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  else {
    *aLength = sVar1;
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

Error CborValue::Serialize(uint8_t *aBuf, size_t &aLength, size_t aMaxLength) const
{
    ASSERT(mCbor != nullptr);
    ssize_t written = cn_cbor_encoder_write(aBuf, 0, aMaxLength, mCbor);
    if (written == -1)
    {
        return ERROR_OUT_OF_MEMORY("serialize CBOR value");
    }

    aLength = written;
    return ERROR_NONE;
}